

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void expr_to_slot(Parser *psr,uint8_t dest,Node *node)

{
  BcIns BVar1;
  int target_idx;
  int target_idx_00;
  Function *pFVar2;
  int fcase;
  int tcase;
  BcIns ins_3;
  BcIns *ins_2;
  BcIns ins_1;
  BcIns ins;
  Node *node_local;
  uint8_t dest_local;
  Parser *psr_local;
  
  expr_discharge(psr,node);
  switch(node->type) {
  case NODE_PRIM:
    BVar1 = bc_new2(BC_SET_P,dest,(uint16_t)(node->field_1).prim);
    pFVar2 = psr_fn(psr);
    fn_emit(pFVar2,BVar1);
    break;
  case NODE_CONST:
    BVar1 = bc_new2(BC_SET_N,dest,(node->field_1).const_idx);
    pFVar2 = psr_fn(psr);
    fn_emit(pFVar2,BVar1);
    break;
  case NODE_RELOC:
    pFVar2 = psr_fn(psr);
    bc_set_arg1(pFVar2->ins + (node->field_1).reloc_idx,dest);
    break;
  case NODE_NON_RELOC:
    if ((node->field_1).slot != dest) {
      BVar1 = bc_new2(BC_MOV,dest,(ushort)(node->field_1).slot);
      pFVar2 = psr_fn(psr);
      fn_emit(pFVar2,BVar1);
    }
    break;
  case NODE_JMP:
    jmp_ensure_true_falls_through(psr,node);
    pFVar2 = psr_fn(psr);
    BVar1 = bc_new2(BC_SET_P,dest,3);
    target_idx = fn_emit(pFVar2,BVar1);
    pFVar2 = psr_fn(psr);
    BVar1 = bc_new1(BC_JMP,0x800001);
    fn_emit(pFVar2,BVar1);
    pFVar2 = psr_fn(psr);
    BVar1 = bc_new2(BC_SET_P,dest,2);
    target_idx_00 = fn_emit(pFVar2,BVar1);
    jmp_list_patch(psr,(node->field_1).reloc_idx,target_idx);
    jmp_list_patch(psr,(node->field_1).jmp.false_list,target_idx_00);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                  ,0x278,"void expr_to_slot(Parser *, uint8_t, Node *)");
  }
  node->type = NODE_NON_RELOC;
  (node->field_1).slot = dest;
  return;
}

Assistant:

static void expr_to_slot(Parser *psr, uint8_t dest, Node *node) {
	// Only deal with discharged values
	expr_discharge(psr, node);
	switch (node->type) {
	case NODE_PRIM: {
		// Emit an BC_SET_P instruction
		BcIns ins = bc_new2(BC_SET_P, dest, node->prim);
		fn_emit(psr_fn(psr), ins);
		break;
	}

	case NODE_NON_RELOC:
		// Only emit a MOV if the destination is different from the source slot
		if (node->slot != dest) {
			BcIns ins = bc_new2(BC_MOV, dest, node->slot);
			fn_emit(psr_fn(psr), ins);
		}
		break;

	case NODE_RELOC: {
		// Modify the destination stack slot for the relocatable instruction
		BcIns *ins = &psr_fn(psr)->ins[node->reloc_idx];
		bc_set_arg1(ins, dest);
		break;
	}

	case NODE_CONST: {
		// The only constant type we have at the moment is a number
		BcIns ins = bc_new2(BC_SET_N, dest, node->const_idx);
		fn_emit(psr_fn(psr), ins);
		break;
	}

	case NODE_JMP: {
		// Ensure the true case falls through
		jmp_ensure_true_falls_through(psr, node);

		// Emit a set/jmp/set sequence
		int tcase = fn_emit(psr_fn(psr), bc_new2(BC_SET_P, dest, PRIM_TRUE));
		fn_emit(psr_fn(psr), bc_new1(BC_JMP, JMP_BIAS + 1));
		int fcase = fn_emit(psr_fn(psr), bc_new2(BC_SET_P, dest, PRIM_FALSE));

		// Patch the true and false lists to their respective cases
		jmp_list_patch(psr, node->jmp.true_list, tcase);
		jmp_list_patch(psr, node->jmp.false_list, fcase);
		break;
	}

	default:
		UNREACHABLE();
	}

	// `node` is now a non-reloc in a specific slot
	node->type = NODE_NON_RELOC;
	node->slot = dest;
}